

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void arm11mpcore_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),4);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x11);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x18);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x14);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fb022;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x647) = 0x410120b4;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x63a) = 0x11111111;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31d4) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0x1d192992;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x649) = 1;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 0;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 2;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31bc) = 0x1100103;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x638) = 0x10020302;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31c4) = 0x1222000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x634) = 0x100011;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31a4) = 0x12002111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x635) = 0x11221011;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31ac) = 0x1102131;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x636) = 0x141;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x662) = 1;
  return;
}

Assistant:

static void arm11mpcore_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V6K);
    set_feature(&cpu->env, ARM_FEATURE_VAPA);
    set_feature(&cpu->env, ARM_FEATURE_MPIDR);
    set_feature(&cpu->env, ARM_FEATURE_DUMMY_C15_REGS);
    cpu->midr = 0x410fb022;
    cpu->reset_fpsid = 0x410120b4;
    cpu->isar.mvfr0 = 0x11111111;
    cpu->isar.mvfr1 = 0x00000000;
    cpu->ctr = 0x1d192992; /* 32K icache 32K dcache */
    cpu->id_pfr0 = 0x111;
    cpu->id_pfr1 = 0x1;
    cpu->isar.id_dfr0 = 0;
    cpu->id_afr0 = 0x2;
    cpu->isar.id_mmfr0 = 0x01100103;
    cpu->isar.id_mmfr1 = 0x10020302;
    cpu->isar.id_mmfr2 = 0x01222000;
    cpu->isar.id_isar0 = 0x00100011;
    cpu->isar.id_isar1 = 0x12002111;
    cpu->isar.id_isar2 = 0x11221011;
    cpu->isar.id_isar3 = 0x01102131;
    cpu->isar.id_isar4 = 0x141;
    cpu->reset_auxcr = 1;
}